

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.hpp
# Opt level: O2

void __thiscall diy::Bounds<long>::Bounds(Bounds<long> *this,int dim)

{
  DynamicPoint<long,_4UL>::DynamicPoint(&this->min,(long)dim,0);
  DynamicPoint<long,_4UL>::DynamicPoint(&this->max,(long)dim,0);
  return;
}

Assistant:

Bounds(int dim): min(dim), max(dim)                                 {}